

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

result * __thiscall
lest::
expression_lhs<nonstd::vptr::value_ptr<int,nonstd::vptr::detail::default_clone<int>,std::default_delete<int>>const&>
::operator>=(result *__return_storage_ptr__,
            expression_lhs<nonstd::vptr::value_ptr<int,nonstd::vptr::detail::default_clone<int>,std::default_delete<int>>const&>
            *this,int *rhs)

{
  lest *this_00;
  bool bVar1;
  int *in_R8;
  allocator<char> local_69;
  string local_68;
  string local_48 [32];
  
  bVar1 = nonstd::vptr::operator>=
                    (*(value_ptr<int,_nonstd::vptr::detail::default_clone<int>,_std::default_delete<int>_>
                       **)this,rhs);
  this_00 = *(lest **)this;
  std::__cxx11::string::string<std::allocator<char>>(local_48,">=",&local_69);
  to_string<nonstd::vptr::value_ptr<int,nonstd::vptr::detail::default_clone<int>,std::default_delete<int>>,int>
            (&local_68,this_00,
             (value_ptr<int,_nonstd::vptr::detail::default_clone<int>,_std::default_delete<int>_> *)
             local_48,(string *)rhs,in_R8);
  __return_storage_ptr__->passed = bVar1;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->decomposition,(string *)&local_68)
  ;
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string(local_48);
  return __return_storage_ptr__;
}

Assistant:

result operator> ( R const & rhs ) { return result( lhs >  rhs, to_string( lhs, ">" , rhs ) ); }